

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void anon_unknown.dwarf_2c832::test_performance(int loop_count)

{
  rect_size local_50;
  rect_size local_40;
  rect_size local_30;
  rect_size local_20;
  int local_c;
  int loop_count_local;
  
  local_c = loop_count;
  rect_size::rect_size(&local_20,0x17c,0x11f);
  test_file("test/alphatest.raw",0,local_20,8,4,false,local_c);
  rect_size::rect_size(&local_30,0x400,0x400);
  test_file("test/MR2_UNC",0x6c0,local_30,0x10,1,true,local_c);
  rect_size::rect_size(&local_40,0x400,0x400);
  test_file("test/0015.raw",0,local_40,8,1,false,local_c);
  rect_size::rect_size(&local_50,0x500,0x400);
  test_file("test/desktop.ppm",0x28,local_50,8,3,false,local_c);
  return;
}

Assistant:

void test_performance(const int loop_count)
{
    // RGBA image (This is a common PNG sample)
    test_file("test/alphatest.raw", 0, {380, 287}, 8, 4, false, loop_count);

    // 16 bit mono
    test_file("test/MR2_UNC", 1728, {1024, 1024}, 16, 1, true, loop_count);

    // 8 bit mono
    test_file("test/0015.raw", 0, {1024, 1024}, 8, 1, false, loop_count);

    // 8 bit color
    test_file("test/desktop.ppm", 40, {1280, 1024}, 8, 3, false, loop_count);
}